

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O1

void __thiscall FGLRenderer::PostProcessFXAA(FGLRenderer *this)

{
  FFXAAShader *pFVar1;
  GLfloat resolution [2];
  FGLPostProcessState savedState;
  float local_40;
  float local_3c;
  FGLPostProcessState local_38;
  
  if (gl_postprocess.Value != 0) {
    local_40 = (float)this->mBuffers->mWidth;
    local_3c = (float)this->mBuffers->mHeight;
    FGLPostProcessState::FGLPostProcessState(&local_38);
    FGLRenderBuffers::BindNextFB(this->mBuffers);
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    FFXAAShader::Bind(this->mFXAAShader);
    pFVar1 = this->mFXAAShader;
    if ((pFVar1->InputTexture).mBuffer != 0) {
      (pFVar1->InputTexture).mBuffer = 0;
      (*_ptrc_glUniform1i)((pFVar1->InputTexture).mIndex,0);
    }
    FBufferedUniform2f::Set(&this->mFXAAShader->Resolution,&local_40);
    (*(this->mVBO->super_FVertexBuffer)._vptr_FVertexBuffer[2])();
    gl_RenderState.mCurrentVertexBuffer = (FVertexBuffer *)0x0;
    (*_ptrc_glDrawArrays)(5,8,4);
    FGLRenderBuffers::NextTexture(this->mBuffers);
    FGLPostProcessState::~FGLPostProcessState(&local_38);
  }
  return;
}

Assistant:

void FGLRenderer::PostProcessFXAA()
{
	if (0 == gl_postprocess)
	{
		return;
	}

	const GLfloat resolution[2] =
	{
		static_cast<GLfloat>(mBuffers->GetWidth()),
		static_cast<GLfloat>(mBuffers->GetHeight())
	};

	FGLPostProcessState savedState;

	mBuffers->BindNextFB();
	mBuffers->BindCurrentTexture(0);
	mFXAAShader->Bind();
	mFXAAShader->InputTexture.Set(0);
	mFXAAShader->Resolution.Set(resolution);
	RenderScreenQuad();
	mBuffers->NextTexture();
}